

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ipc::Deferred<perfetto::protos::gen::GetTraceStatsResponse>::Deferred
          (Deferred<perfetto::protos::gen::GetTraceStatsResponse> *this,
          function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>)>
          *callback)

{
  function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>)> local_58
  ;
  function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> local_38;
  function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>)>
  *local_18;
  function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>)>
  *callback_local;
  Deferred<perfetto::protos::gen::GetTraceStatsResponse> *this_local;
  
  local_18 = callback;
  callback_local =
       (function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>)> *)
       this;
  std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::function
            (&local_38,(nullptr_t)0x0);
  DeferredBase::DeferredBase(&this->super_DeferredBase,&local_38);
  std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::~function(&local_38);
  std::function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>)>::
  function(&local_58,callback);
  Bind(this,&local_58);
  std::function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::GetTraceStatsResponse>)>::
  ~function(&local_58);
  return;
}

Assistant:

explicit Deferred(std::function<void(AsyncResult<T>)> callback = nullptr) {
    Bind(std::move(callback));
  }